

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O2

void clone_setn(t_clone *x,t_floatarg f)

{
  uint uVar1;
  t_atom *ptVar2;
  int oldstate;
  uint uVar3;
  int iVar4;
  _glist *p_Var5;
  t_copy *ptVar6;
  t_out **pptVar7;
  t_out *ptVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int m;
  long lVar12;
  bool bVar13;
  
  oldstate = canvas_suspend_dsp();
  uVar1 = x->x_n;
  lVar10 = (long)(int)uVar1;
  uVar3 = (uint)f;
  if ((int)uVar3 < 1) {
    pd_error(x,"can\'t resize to zero or negative number; setting to 1");
    uVar3 = 1;
  }
  uVar9 = (ulong)uVar3;
  if ((int)uVar1 < (int)uVar3) {
    while (lVar10 < (long)uVar9) {
      ptVar2 = x->x_argv;
      ptVar2->a_type = A_FLOAT;
      m = (int)lVar10;
      (ptVar2->a_w).w_float = (float)(x->x_startvoice + m);
      p_Var5 = clone_makeone(x->x_s,x->x_argc - x->x_suppressvoice,x->x_argv + x->x_suppressvoice);
      if (p_Var5 == (_glist *)0x0) {
        pd_error(x,"clone: couldn\'t create \'%s\'",x->x_s->s_name);
        goto LAB_0013764c;
      }
      ptVar6 = (t_copy *)resizebytes(x->x_vec,lVar10 * 0x10,(lVar10 + 1) * 0x10);
      x->x_vec = ptVar6;
      ptVar6[lVar10].c_gl = p_Var5;
      ptVar6[lVar10].c_on = 0;
      pptVar7 = (t_out **)resizebytes(x->x_outvec,lVar10 * 8,lVar10 * 8 + 8);
      x->x_outvec = pptVar7;
      ptVar8 = (t_out *)getbytes((long)x->x_nout * 0x18);
      x->x_outvec[lVar10] = ptVar8;
      lVar12 = 0;
      for (lVar11 = 0; lVar11 < x->x_nout; lVar11 = lVar11 + 1) {
        *(_class **)((long)&ptVar8->o_pd + lVar12) = clone_out_class;
        iVar4 = obj_issignaloutlet(&x->x_vec->c_gl->gl_obj,m);
        *(int *)((long)&ptVar8->o_signal + lVar12) = iVar4;
        *(int *)((long)&ptVar8->o_n + lVar12) = x->x_startvoice + m;
        *(undefined8 *)((long)&ptVar8->o_outlet + lVar12) =
             *(undefined8 *)((long)&(*x->x_outvec)->o_outlet + lVar12);
        obj_connect(&(x->x_vec[lVar10].c_gl)->gl_obj,(int)lVar11,
                    (t_object *)((long)&ptVar8->o_pd + lVar12),0);
        lVar12 = lVar12 + 0x18;
      }
      x->x_n = x->x_n + 1;
      lVar10 = lVar10 + 1;
    }
  }
  if ((int)uVar3 < (int)uVar1) {
    lVar11 = uVar1 - uVar9;
    lVar10 = uVar9 << 4;
    while( true ) {
      bVar13 = lVar11 == 0;
      lVar11 = lVar11 + -1;
      if (bVar13) break;
      canvas_closebang(*(_glist **)((long)&x->x_vec->c_gl + lVar10));
      pd_free(*(t_pd **)((long)&x->x_vec->c_gl + lVar10));
      lVar10 = lVar10 + 0x10;
    }
    ptVar6 = (t_copy *)resizebytes(x->x_vec,(ulong)uVar1 << 4,uVar9 << 4);
    x->x_vec = ptVar6;
    x->x_n = uVar3;
  }
LAB_0013764c:
  canvas_resume_dsp(oldstate);
  return;
}

Assistant:

void clone_setn(t_clone *x, t_floatarg f)
{
    int dspstate = canvas_suspend_dsp();
    int nwas = x->x_n, wantn = f, i, j;
    if (wantn < 1)
    {
        pd_error(x, "can't resize to zero or negative number; setting to 1");
        wantn = 1;
    }
    if (wantn > nwas)
        for (i = nwas; i < wantn; i++)
    {
        t_canvas *c;
        t_out *outvec;
        SETFLOAT(x->x_argv, x->x_startvoice + i);
        if (!(c = clone_makeone(x->x_s, x->x_argc - x->x_suppressvoice,
            x->x_argv + x->x_suppressvoice)))
        {
            pd_error(x, "clone: couldn't create '%s'", x->x_s->s_name);
            goto done;
        }
        x->x_vec = (t_copy *)t_resizebytes(x->x_vec, i * sizeof(t_copy),
            (i+1) * sizeof(t_copy));
        x->x_vec[i].c_gl = c;
        x->x_vec[i].c_on = 0;
        x->x_outvec = (t_out **)t_resizebytes(x->x_outvec,
            i * sizeof(*x->x_outvec), (i+1) * sizeof(*x->x_outvec));
        x->x_outvec[i] = outvec =
            (t_out *)getbytes(x->x_nout * sizeof(*outvec));
        for (j = 0; j < x->x_nout; j++)
        {
            outvec[j].o_pd = clone_out_class;
            outvec[j].o_signal =
                obj_issignaloutlet(&x->x_vec[0].c_gl->gl_obj, i);
            outvec[j].o_n = x->x_startvoice + i;
            outvec[j].o_outlet =
                x->x_outvec[0][j].o_outlet;
            obj_connect(&x->x_vec[i].c_gl->gl_obj, j,
                (t_object *)(&outvec[j]), 0);
        }
        x->x_n++;
    }
    if (wantn < nwas)
    {
        for (i = wantn; i < nwas; i++)
        {
            canvas_closebang(x->x_vec[i].c_gl);
            pd_free(&x->x_vec[i].c_gl->gl_pd);
        }
        x->x_vec = (t_copy *)t_resizebytes(x->x_vec, nwas * sizeof(t_copy),
            wantn * sizeof(*x->x_vec));
        x->x_n = wantn;
    }
done:
    canvas_resume_dsp(dspstate);
}